

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O1

void __thiscall
RTree::DFT_recursive
          (RTree *this,Point q,int k,RTree_node *node,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L
          ,vector<float,_std::allocator<float>_> *ddk,float *poor)

{
  iterator __position;
  vector<d_leaf*,std::allocator<d_leaf*>> *this_00;
  RTree *this_01;
  RTree_node **__args;
  ulong __new_size;
  long lVar1;
  long lVar2;
  float fVar3;
  vector<float,_std::allocator<float>_> branch_value;
  vector<RTree_node_*,_std::allocator<RTree_node_*>_> branch;
  vector<float,_std::allocator<float>_> local_88;
  vector<RTree_node_*,_std::allocator<RTree_node_*>_> local_68;
  vector<d_leaf*,std::allocator<d_leaf*>> *local_48;
  float local_3c;
  RTree *local_38;
  
  local_48 = (vector<d_leaf*,std::allocator<d_leaf*>> *)L;
  local_38 = this;
  if (node->is_leaf == true) {
    if (0 < node->elements) {
      lVar2 = 0;
      lVar1 = 0;
      do {
        fVar3 = Polygon::distance_geometric
                          (*(Polygon **)
                            ((long)&((node->data_leafs).
                                     super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                     super__Vector_impl_data._M_start)->region + lVar2),q);
        local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_88.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,fVar3);
        __position._M_current =
             (ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (ddk,__position,(float *)&local_88);
        }
        else {
          *__position._M_current = fVar3;
          (ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((long)&((node->data_leafs).
                                     super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                     super__Vector_impl_data._M_start)->polygon + lVar2);
        std::vector<d_leaf*,std::allocator<d_leaf*>>::emplace_back<d_leaf*>
                  (local_48,(d_leaf **)&local_88);
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar1 < node->elements);
    }
    this_00 = local_48;
    __new_size = (ulong)k;
    if (__new_size <
        (ulong)((long)(ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      insert_sort<d_leaf>(local_38,ddk,(vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)local_48);
      std::vector<float,_std::allocator<float>_>::resize(ddk,__new_size);
      std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::resize
                ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)this_00,__new_size);
      *poor = (ddk->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[__new_size - 1];
    }
  }
  else {
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (float *)0x0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (float *)0x0;
    local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (RTree_node **)0x0;
    local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (RTree_node **)0x0;
    if (0 < node->elements) {
      lVar1 = 8;
      lVar2 = 0;
      do {
        local_3c = Polygon::distance_geometric
                             (*(Polygon **)
                               ((long)(node->data_internal_node).
                                      super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar1 + -8),q);
        if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_3c);
        }
        else {
          *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = local_3c;
          local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        __args = (RTree_node **)
                 ((long)&((node->data_internal_node).
                          super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>.
                          _M_impl.super__Vector_impl_data._M_start)->region + lVar1);
        if (local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<RTree_node*,std::allocator<RTree_node*>>::_M_realloc_insert<RTree_node*const&>
                    ((vector<RTree_node*,std::allocator<RTree_node*>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = *__args;
          local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (lVar2 < node->elements);
    }
    this_01 = local_38;
    insert_sort<RTree_node>(local_38,&local_88,&local_68);
    if (0 < node->elements) {
      lVar1 = 0;
      do {
        if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar1] <= *poor) {
          DFT_recursive(this_01,q,k,
                        local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar1],
                        (vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)local_48,ddk,poor);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < node->elements);
    }
    if (local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RTree::DFT_recursive(Point q, int k, RTree_node * node, std::vector<d_leaf *> & L, std::vector<float> & ddk,float & poor){
	if(node->is_leaf){
        for(int i = 0; i < node->elements; i++){
            ddk.push_back(node->data_leafs[i].region->distance_geometric(q));
            L.push_back(&node->data_leafs[i]);
        }
        if(ddk.size()>k)
        {
	        insert_sort<d_leaf>(ddk,L);
            ddk.resize(k);
            L.resize(k);
        	poor=ddk[k-1];
        }
    }
    else{
	    std::vector<float> branch_value;
		std::vector<RTree_node *> branch;
        for(int i = 0; i < node->elements; i++){
	        branch_value.push_back(node->data_internal_node[i].region->distance_geometric(q));
            branch.push_back(node->data_internal_node[i].child);
        }
        insert_sort<RTree_node>(branch_value,branch);
		for(int i = 0; i < node->elements; i++){
  	        if(branch_value[i]<=poor){
                DFT_recursive(q,k,branch[i],L,ddk,poor);
            }
        }
      }
}